

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacBac.c
# Opt level: O0

void Bac_ManReadBacVecInt(Vec_Str_t *vOut,int *pPos,Vec_Int_t *p,int nSize)

{
  int iVar1;
  int iVar2;
  int *__dest;
  char *pcVar3;
  int nSize_local;
  Vec_Int_t *p_local;
  int *pPos_local;
  Vec_Str_t *vOut_local;
  
  __dest = Vec_IntArray(p);
  pcVar3 = Vec_StrArray(vOut);
  memcpy(__dest,pcVar3 + *pPos,(long)nSize);
  *pPos = nSize + *pPos;
  p->nSize = nSize / 4;
  iVar1 = Vec_IntSize(p);
  iVar2 = Vec_IntCap(p);
  if (iVar1 == iVar2) {
    return;
  }
  __assert_fail("Vec_IntSize(p) == Vec_IntCap(p)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/bac/bacBac.c"
                ,100,"void Bac_ManReadBacVecInt(Vec_Str_t *, int *, Vec_Int_t *, int)");
}

Assistant:

void Bac_ManReadBacVecInt( Vec_Str_t * vOut, int * pPos, Vec_Int_t * p, int nSize )
{
    memcpy( Vec_IntArray(p), Vec_StrArray(vOut) + *pPos, nSize );
    *pPos += nSize;
    p->nSize = nSize / 4;
    assert( Vec_IntSize(p) == Vec_IntCap(p) );
}